

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O1

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintTwoGenericBoxed>::create
          (ChClassRegistration<chrono::ChConstraintTwoGenericBoxed> *this,ChArchiveIn *marchive)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0xa8);
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined4 *)(puVar1 + 5) = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 1;
  *(undefined4 *)(puVar1 + 6) = 1;
  puVar1[7] = 0;
  *(undefined1 (*) [64])(puVar1 + 9) = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])(puVar1 + 0xb) = ZEXT464(0) << 0x40;
  *puVar1 = &PTR__ChConstraintTwoGeneric_00b62da0;
  puVar1[0x13] = 0xbff0000000000000;
  puVar1[0x14] = 0x3ff0000000000000;
  return puVar1;
}

Assistant:

virtual void* create(ChArchiveIn& marchive) {
        return _archive_in_create(marchive);
    }